

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotator.h
# Opt level: O1

Matrix<60,_60> __thiscall
singular::Rotator::applyFromRightTo<60,60>(Rotator *this,Matrix<60,_60> *lhs,int k)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  void *__src;
  void *__dest;
  uint in_ECX;
  ulong uVar7;
  undefined4 in_register_00000014;
  long lVar8;
  
  if (0x3a < (int)in_ECX) {
    __assert_fail("N >= k + 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kikuomax[P]singular/src/singular/Rotator.h"
                  ,0xa6,
                  "Matrix<M, N> singular::Rotator::applyFromRightTo(const Matrix<M, N> &, int) [M = 60, N = 60]"
                 );
  }
  __dest = operator_new__(0x7080);
  __src = *(void **)CONCAT44(in_register_00000014,k);
  memmove(__dest,__src,0x7080);
  this->elements[0] = (double)__dest;
  if (in_ECX < 0x3c) {
    pdVar1 = lhs->pBlock;
    pdVar2 = lhs[1].pBlock;
    pdVar3 = lhs[2].pBlock;
    pdVar4 = lhs[3].pBlock;
    uVar7 = (ulong)in_ECX;
    lVar8 = 0;
    do {
      dVar5 = *(double *)((long)__src + lVar8 + uVar7 * 8);
      dVar6 = *(double *)((long)__src + lVar8 + uVar7 * 8 + 8);
      *(double *)((long)__dest + lVar8 + uVar7 * 8) =
           dVar5 * (double)pdVar1 + dVar6 * (double)pdVar3;
      *(double *)((long)__dest + lVar8 + uVar7 * 8 + 8) =
           dVar5 * (double)pdVar2 + dVar6 * (double)pdVar4;
      lVar8 = lVar8 + 0x1e0;
    } while (lVar8 != 0x7080);
    return (Matrix<60,_60>)this->elements;
  }
  __assert_fail("j >= 0 && j < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kikuomax[P]singular/src/singular/Matrix.h"
                ,0xb6,"double singular::Matrix<60, 60>::operator()(int, int) const [M = 60, N = 60]"
               );
}

Assistant:

Matrix< M, N > applyFromRightTo(const Matrix< M, N >& lhs, int k) {
			assert(N >= k + 2);
			Matrix< M, N > m = lhs.clone();
			for (int i = 0; i < M; ++i) {
				double x1 = lhs(i, k);
				double x2 = lhs(i, k + 1);
				m(i, k) = x1 * this->elements[0] + x2 * this->elements[2];
				m(i, k + 1) = x1 * this->elements[1] + x2 * this->elements[3];
			}
			return m;
		}